

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.cc
# Opt level: O0

int RAND_load_file(char *file,long max_bytes)

{
  long num_local;
  char *path_local;
  
  if (max_bytes < 0) {
    path_local._4_4_ = 1;
  }
  else if (max_bytes < 0x80000000) {
    path_local._4_4_ = (int)max_bytes;
  }
  else {
    path_local._4_4_ = 0x7fffffff;
  }
  return path_local._4_4_;
}

Assistant:

int RAND_load_file(const char *path, long num) {
  if (num < 0) {  // read the "whole file"
    return 1;
  } else if (num <= INT_MAX) {
    return (int)num;
  } else {
    return INT_MAX;
  }
}